

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

void __thiscall Expr::emitjumps(Expr *this,string *test,int t,int f)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  stringstream ss;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  long local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  if (f == 0 || t == 0) {
    if (t == 0) {
      if (f == 0) goto LAB_0010a58a;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"iffalse ",8);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(test->_M_dataplus)._M_p,test->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," goto L",7);
      std::ostream::operator<<(poVar1,f);
      std::__cxx11::stringbuf::str();
      Node::emit(&this->super_Node,&local_218);
      paVar2 = &local_218.field_2;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"if ",3);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(test->_M_dataplus)._M_p,test->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," goto L",7);
      std::ostream::operator<<(poVar1,t);
      std::__cxx11::stringbuf::str();
      Node::emit(&this->super_Node,&local_1f8);
      paVar2 = &local_1f8.field_2;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"if ",3);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(test->_M_dataplus)._M_p,test->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," goto L",7);
    std::ostream::operator<<(poVar1,t);
    std::__cxx11::stringbuf::str();
    Node::emit(&this->super_Node,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::ios::clear((int)(stringstream *)local_1b8 + (int)*(undefined8 *)(local_1b8[0] + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"goto L",6);
    std::ostream::operator<<(local_1a8,f);
    std::__cxx11::stringbuf::str();
    Node::emit(&this->super_Node,&local_1d8);
    paVar2 = &local_1d8.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar2->_M_allocated_capacity)[-2] != paVar2) {
    operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1);
  }
LAB_0010a58a:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

virtual void emitjumps(std::string test, int t, int f) {
		std::stringstream ss;

		if (t != 0 && f != 0) {
			ss << "if " << test << " goto L" << t;
			emit(ss.str());
			ss.clear();
			ss << "goto L" << f;
			emit(ss.str());
		}
		else if (t != 0) {
			ss << "if " << test << " goto L" << t;
			emit(ss.str());
		}
		else if (f != 0) {
			ss << "iffalse " << test << " goto L" << f;
			emit(ss.str());
		}
	}